

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

uint32_t __thiscall Bitmap::getTextWidth(Bitmap *this,char *text)

{
  char cVar1;
  char *pcVar2;
  uint32_t uVar3;
  GlyphIterator *this_00;
  
  uVar3 = 0;
  if ((this->font != (GFXfont *)0x0) && (uVar3 = 0, *text != '\0')) {
    this_00 = this->glyphIterator;
    pcVar2 = text + 1;
    uVar3 = 0;
    do {
      GlyphIterator::init(this_00,(EVP_PKEY_CTX *)this->font);
      this_00 = this->glyphIterator;
      uVar3 = uVar3 + this_00->xAdvance;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return uVar3;
}

Assistant:

uint32_t Bitmap::getTextWidth(const char * text) const
{
   char character;
   uint32_t width;

   if (this->font == nullptr)
   {
      return 0;
   }

   width = 0;
   while ((character = *text++) != 0)
   {
      //draw character
      glyphIterator->init(this->font, character);
      width += glyphIterator->xAdvance;
   }
   return width;
}